

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlmodelserialiser.cpp
# Opt level: O2

void __thiscall
HtmlModelSerialiser::HtmlModelSerialiser
          (HtmlModelSerialiser *this,QAbstractItemModel *model,QObject *parent)

{
  HtmlModelSerialiserPrivate *this_00;
  
  *(undefined ***)&(this->super_AbstractStringSerialiser).super_AbstractModelSerialiser =
       &PTR_metaObject_00167d08;
  this_00 = (HtmlModelSerialiserPrivate *)operator_new(0x40);
  HtmlModelSerialiserPrivate::HtmlModelSerialiserPrivate(this_00,this);
  AbstractStringSerialiser::AbstractStringSerialiser
            (&this->super_AbstractStringSerialiser,(AbstractStringSerialiserPrivate *)this_00,parent
            );
  *(undefined ***)&(this->super_AbstractStringSerialiser).super_AbstractModelSerialiser =
       &PTR_metaObject_00167d08;
  AbstractModelSerialiser::setModel((AbstractModelSerialiser *)this,model);
  return;
}

Assistant:

HtmlModelSerialiser::HtmlModelSerialiser(const QAbstractItemModel *model, QObject *parent)
    : AbstractStringSerialiser(*new HtmlModelSerialiserPrivate(this), parent)
{
    setModel(model);
}